

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.hpp
# Opt level: O1

void __thiscall helics::MessageDestOperator::~MessageDestOperator(MessageDestOperator *this)

{
  _Manager_type p_Var1;
  
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__MessageDestOperator_00551f48;
  p_Var1 = (this->DestUpdateFunction).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->DestUpdateFunction,(_Any_data *)&this->DestUpdateFunction,
              __destroy_functor);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

class HELICS_CXX_EXPORT MessageDestOperator: public FilterOperator {
  public:
    /** default constructor*/
    MessageDestOperator() = default;
    /** set the function to modify the time of the message in the constructor*/
    explicit MessageDestOperator(
        std::function<std::string(const std::string&, const std::string&)> userDestFunction);
    /** set the function to modify the time of the message*/
    void setDestFunction(
        std::function<std::string(const std::string&, const std::string&)> userDestFunction);
    virtual bool isMessageGenerating() const override { return true; }

  private:
    std::function<std::string(const std::string&, const std::string&)>
        DestUpdateFunction;  //!< the function that actually does the processing
    virtual std::unique_ptr<Message> process(std::unique_ptr<Message> message) override;
}